

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

float Lf_CutDeref_rec(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  int i;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  float fVar4;
  word CutTemp [10];
  float local_8c;
  Lf_Cut_t local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88.iFunc = 0;
  local_88._20_4_ = 0;
  uStack_70 = 0;
  local_88.Sign = 0;
  local_88.Delay = 0;
  local_88.Flow = 0.0;
  local_8c = Lf_CutArea(p,pCut);
  for (uVar3 = 0;
      (uVar3 < (byte)pCut->field_0x17 && (i = *(int *)((long)&pCut[1].Sign + uVar3 * 4), i != 0));
      uVar3 = uVar3 + 1) {
    iVar1 = Vec_IntEntry(&p->vOffsets,i);
    if (-1 < iVar1) {
      iVar1 = Vec_IntEntry(&p->vOffsets,i);
      piVar2 = Vec_IntEntryP(&p->vMapRefs,iVar1);
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Lf_ObjCutBestNew(p,i,&local_88);
        fVar4 = Lf_CutDeref_rec(p,&local_88);
        local_8c = local_8c + fVar4;
      }
    }
  }
  return local_8c;
}

Assistant:

float Lf_CutDeref_rec( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    word CutTemp[LF_CUT_WORDS] = {0};
    float Count = Lf_CutArea(p, pCut);
    int i, Var; 
    Lf_CutForEachVar( pCut, Var, i )
        if ( !Lf_ObjMapRefDec(p, Var) )
            Count += Lf_CutDeref_rec( p, Lf_ObjCutBestNew(p, Var, (Lf_Cut_t *)CutTemp) );
    return Count;
}